

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

SSTableData * __thiscall MemTable::collectData(SSTableData *__return_storage_ptr__,MemTable *this)

{
  _List_node_base *p_Var1;
  SSTableDataEntry *pSVar2;
  SSTableDataEntry *__args;
  
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  __args = (SSTableDataEntry *)p_Var1[1]._M_prev;
  pSVar2 = (SSTableDataEntry *)p_Var1[2]._M_next;
  while (__args = (SSTableDataEntry *)__args[1].timestamp, __args != pSVar2) {
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::emplace_back<SSTableDataEntry>
              (__return_storage_ptr__,__args);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableData MemTable::collectData() {
    auto new_data = SSTableData{};
    auto *bottomStart = (--qlist.end())->first()->succ;
    auto *bottomEnd = (--qlist.end())->last();
    while (bottomStart != bottomEnd) {
        new_data.push_back(std::move(bottomStart->data));
        bottomStart = bottomStart->succ;
    }
    return new_data;
}